

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
AnalyzeVariableDefinition
          (ExpressionContext *ctx,SynVariableDefinition *syntax,uint alignment,TypeBase *type)

{
  Allocator *allocator;
  ScopeData *scope;
  TypeStruct *pTVar1;
  VariableData *pVVar2;
  char *pcVar3;
  FunctionData *function;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  SynIdentifier *name;
  undefined4 extraout_var_01;
  TypeFunction *type_00;
  undefined4 extraout_var_02;
  ExprError *pEVar9;
  SynBase *pSVar10;
  undefined4 extraout_var_03;
  _func_int **pp_Var11;
  ExprGetAddress *pEVar12;
  ExprBase *pEVar13;
  undefined4 extraout_var_05;
  TypeRef *pTVar14;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TypeBase *pTVar16;
  undefined4 extraout_var_08;
  ExprZeroInitialize *this_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  ExprGetAddress *pEVar17;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  char *pcVar18;
  char *in_R8;
  TypeFunction *type_01;
  InplaceStr name_00;
  InplaceStr IVar19;
  FunctionValue bestOverload;
  IntrusiveList<MatchData> aliases;
  VariableData *this;
  VariableHandle *pVVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_04;
  
  if (syntax->name == (SynIdentifier *)0x0) {
LAB_0017dada:
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar13 = (ExprBase *)CONCAT44(extraout_var_01,iVar6);
    pTVar16 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar13->typeID = 0;
    pEVar13->source = &syntax->super_SynBase;
    pEVar13->type = pTVar16;
    pEVar13->next = (ExprBase *)0x0;
    pEVar13->listed = false;
    pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00248b28;
    pEVar13[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar13[1]._vptr_ExprBase = (_func_int **)&pEVar13[1].source;
    *(undefined8 *)&pEVar13[1].typeID = 0x400000000;
    return pEVar13;
  }
  bestOverload.source = (SynBase *)0x20bdf4;
  bestOverload.function = (FunctionData *)0x20bdf8;
  bVar4 = InplaceStr::operator==(&syntax->name->name,(InplaceStr *)&bestOverload);
  if (bVar4) {
    anon_unknown.dwarf_c6b42::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'this\' is a reserved keyword");
  }
  if ((type != (TypeBase *)0x0) && (type->typeID == 0)) {
    if ((syntax->initializer != (SynBase *)0x0) && (ctx->scope->ownerType == (TypeBase *)0x0)) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_08,iVar6);
      pTVar16 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pSVar10 = (SynBase *)AnalyzeExpression(ctx,syntax->initializer);
      pEVar13->typeID = 0;
      pEVar13->source = &syntax->super_SynBase;
      pEVar13->type = pTVar16;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00248b28;
      pEVar13[2]._vptr_ExprBase = (_func_int **)0x0;
      pEVar13[1]._vptr_ExprBase = (_func_int **)&pEVar13[1].source;
      *(undefined8 *)&pEVar13[1].typeID = 0x400000001;
      pEVar13[1].source = pSVar10;
      return pEVar13;
    }
    goto LAB_0017dada;
  }
  IVar19 = GetVariableNameInScope(ctx,ctx->scope,syntax->name->name);
  name_00.end = in_R8;
  name_00.begin = IVar19.end;
  bVar4 = anon_unknown.dwarf_c6b42::CheckVariableConflict
                    ((anon_unknown_dwarf_c6b42 *)ctx,(ExpressionContext *)syntax,
                     (SynBase *)IVar19.begin,name_00);
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  this = (VariableData *)CONCAT44(extraout_var,iVar6);
  allocator = ctx->allocator;
  scope = ctx->scope;
  iVar6 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var_00,iVar6);
  SynBase::SynBase((SynBase *)name,4,(syntax->name->super_SynBase).begin,
                   (syntax->name->super_SynBase).end);
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
  name->name = IVar19;
  uVar7 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar7 + 1;
  VariableData::VariableData(this,allocator,&syntax->super_SynBase,scope,0,type,name,0,uVar7);
  bVar5 = anon_unknown.dwarf_c6b42::IsLookupOnlyVariable(ctx,this);
  if (bVar5) {
    this->lookupOnly = true;
  }
  if (!bVar4) {
    ExpressionContext::AddVariable(ctx,this,true);
  }
  if ((syntax->initializer == (SynBase *)0x0) || (this->scope->ownerType != (TypeBase *)0x0)) {
    pSVar10 = (SynBase *)0x0;
  }
  else {
    pSVar10 = (SynBase *)AnalyzeExpression(ctx,syntax->initializer);
  }
  if (ctx->typeAuto == type) {
    if (this->scope->ownerType != (TypeBase *)0x0) {
      pTVar16 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar9 = anon_unknown.dwarf_c6b42::ReportExpected
                         (ctx,&syntax->super_SynBase,pTVar16,
                          "ERROR: member variable type cannot be \'auto\'");
      return &pEVar9->super_ExprBase;
    }
    pSVar10 = (SynBase *)ResolveInitializerValue(ctx,&syntax->super_SynBase,(ExprBase *)pSVar10);
    type_00 = (TypeFunction *)pSVar10->end;
    if ((type_00 != (TypeFunction *)0x0) && ((type_00->super_TypeBase).typeID == 0)) {
LAB_0017df10:
      if (!bVar4) {
        DirectChainedMap<IdentifierLookupResult>::remove
                  (&ctx->scope->idLookupMap,(char *)(ulong)this->nameHash);
      }
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_07,iVar6);
      pTVar16 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar13->typeID = 0;
      pEVar13->source = &syntax->super_SynBase;
      pEVar13->type = pTVar16;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00248b28;
      pEVar13[2]._vptr_ExprBase = (_func_int **)0x0;
      pEVar13[1]._vptr_ExprBase = (_func_int **)&pEVar13[1].source;
      *(undefined8 *)&pEVar13[1].typeID = 0x400000001;
      pEVar13[1].source = pSVar10;
      return pEVar13;
    }
  }
  else if (pSVar10 == (SynBase *)0x0 || type->isGeneric != true) {
    type_00 = (TypeFunction *)type;
    if (type->isGeneric != false) {
      if (this->scope->ownerType != (TypeBase *)0x0) {
        pTVar16 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar9 = anon_unknown.dwarf_c6b42::ReportExpected
                           (ctx,&syntax->super_SynBase,pTVar16,
                            "ERROR: member variable type cannot be \'%.*s\'",
                            (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        return &pEVar9->super_ExprBase;
      }
      uVar7 = *(int *)&(type->name).end - (int)(type->name).begin;
      pcVar18 = "ERROR: initializer is required to resolve generic type \'%.*s\'";
      goto LAB_0017e38d;
    }
  }
  else {
    pTVar16 = (TypeBase *)pSVar10->end;
    if ((pTVar16 != (TypeBase *)0x0) && (pTVar16->typeID == 0)) goto LAB_0017df10;
    aliases.head = (MatchData *)0x0;
    aliases.tail = (MatchData *)0x0;
    type_00 = (TypeFunction *)
              MatchGenericType(ctx,&syntax->super_SynBase,type,pTVar16,&aliases,true);
    if ((type_00 == (TypeFunction *)0x0) || ((type_00->super_TypeBase).isGeneric == true)) {
      pcVar18 = (((TypeBase *)pSVar10->end)->name).begin;
      pcVar3 = (type->name).begin;
      anon_unknown.dwarf_c6b42::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: can\'t resolve generic type \'%.*s\' instance for \'%.*s\'",
                 (ulong)(uint)(*(int *)&(((TypeBase *)pSVar10->end)->name).end - (int)pcVar18),
                 pcVar18,(ulong)(uint)(*(int *)&(type->name).end - (int)pcVar3),pcVar3);
    }
    if ((type_00 == (TypeFunction *)0x0) ||
       (type_01 = type_00, (type_00->super_TypeBase).typeID != 0x15)) {
      type_01 = (TypeFunction *)0x0;
    }
    if ((((type_01 != (TypeFunction *)0x0) && (type_01->returnType != (TypeBase *)0x0)) &&
        (type_01->returnType->typeID == 0xe)) &&
       (GetFunctionForType(&bestOverload,ctx,(SynBase *)pSVar10->begin,(ExprBase *)pSVar10,type_01),
       function = bestOverload.function, bestOverload.function != (FunctionData *)0x0)) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pSVar10 = (SynBase *)CONCAT44(extraout_var_02,iVar6);
      ExprFunctionAccess::ExprFunctionAccess
                ((ExprFunctionAccess *)pSVar10,bestOverload.source,&function->type->super_TypeBase,
                 function,bestOverload.context);
      type_00 = function->type;
    }
  }
  if ((alignment == 0) &&
     (((pTVar16 = ctx->scope->ownerType, pTVar16 == (TypeBase *)0x0 ||
       (alignment = pTVar16->alignment, alignment == 0)) ||
      ((type_00->super_TypeBase).alignment <= alignment)))) {
    alignment = (type_00->super_TypeBase).alignment;
  }
  uVar7 = anon_unknown.dwarf_c6b42::AllocateVariableInScope
                    (ctx,&syntax->super_SynBase,alignment,&type_00->super_TypeBase);
  this->type = &type_00->super_TypeBase;
  this->alignment = alignment;
  this->offset = uVar7;
  if ((type_00 == (TypeFunction *)0x0) || ((type_00->super_TypeBase).typeID != 0x18)) {
    type_00 = (TypeFunction *)0x0;
  }
  if ((type_00 == (TypeFunction *)0x0) ||
     (*(char *)((long)&type_00[2].super_TypeBase.size + 2) != '\x01')) {
    if (this->scope->ownerType != (TypeBase *)0x0) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_03,iVar6);
      pTVar16 = ctx->typeVoid;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var11 = (_func_int **)CONCAT44(extraout_var_04,iVar6);
      *pp_Var11 = (_func_int *)syntax->name;
      pp_Var11[1] = (_func_int *)this;
      pp_Var11[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var11 + 3) = 0;
      pEVar13->typeID = 0x1e;
      pEVar13->source = &syntax->super_SynBase;
      pEVar13->type = pTVar16;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
      pEVar13[1]._vptr_ExprBase = pp_Var11;
      *(undefined8 *)&pEVar13[1].typeID = 0;
      return pEVar13;
    }
    if (pSVar10 == (SynBase *)0x0) {
      bVar4 = HasDefaultConstructor(ctx,&syntax->super_SynBase,this->type);
      if (bVar4) {
        pEVar13 = CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true);
        pTVar16 = this->type;
        pEVar13 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar13);
        this_00 = (ExprZeroInitialize *)
                  CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar16,pEVar13);
      }
      else if (((ctx->scope == ctx->globalScope) ||
               (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) || (this->type->size == 0)) {
        this_00 = (ExprZeroInitialize *)0x0;
      }
      else {
        pEVar12 = (ExprGetAddress *)CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true)
        ;
        if ((pEVar12 == (ExprGetAddress *)0x0) ||
           (pEVar17 = pEVar12, (pEVar12->super_ExprBase).typeID != 0x22)) {
          pEVar17 = (ExprGetAddress *)0x0;
        }
        if (pEVar17 == (ExprGetAddress *)0x0) {
          if ((pEVar12 == (ExprGetAddress *)0x0) ||
             (pEVar17 = pEVar12, (pEVar12->super_ExprBase).typeID != 0x16)) {
            pEVar17 = (ExprGetAddress *)0x0;
          }
          if (pEVar17 != (ExprGetAddress *)0x0) {
            pEVar12 = (ExprGetAddress *)pEVar17->variable;
          }
        }
        else {
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pSVar10 = (pEVar12->super_ExprBase).source;
          pTVar14 = ExpressionContext::GetReferenceType(ctx,(pEVar12->super_ExprBase).type);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pVVar15 = (VariableHandle *)CONCAT44(extraout_var_12,iVar8);
          pVVar2 = (VariableData *)pEVar17->variable;
          pVVar15->source = (pEVar17->super_ExprBase).source;
          pVVar15->variable = pVVar2;
          pVVar15->next = (VariableHandle *)0x0;
          pVVar15->listed = false;
          ExprGetAddress::ExprGetAddress
                    ((ExprGetAddress *)CONCAT44(extraout_var_11,iVar6),pSVar10,
                     &pTVar14->super_TypeBase,pVVar15);
          pEVar12 = (ExprGetAddress *)CONCAT44(extraout_var_11,iVar6);
        }
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        this_00 = (ExprZeroInitialize *)CONCAT44(extraout_var_16,iVar6);
        ExprZeroInitialize::ExprZeroInitialize
                  (this_00,syntax->initializer,ctx->typeVoid,&pEVar12->super_ExprBase);
      }
    }
    else {
      if (((TypeBase *)pSVar10->end != (TypeBase *)0x0) && (((TypeBase *)pSVar10->end)->typeID == 0)
         ) {
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar13 = (ExprBase *)CONCAT44(extraout_var_09,iVar6);
        pTVar16 = ctx->typeVoid;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var11 = (_func_int **)CONCAT44(extraout_var_10,iVar6);
        *pp_Var11 = (_func_int *)syntax->name;
        pp_Var11[1] = (_func_int *)this;
        pp_Var11[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var11 + 3) = 0;
        pEVar13->typeID = 0x1e;
        pEVar13->source = &syntax->super_SynBase;
        pEVar13->type = pTVar16;
        pEVar13->next = (ExprBase *)0x0;
        pEVar13->listed = false;
        pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
        pEVar13[1]._vptr_ExprBase = pp_Var11;
        *(SynBase **)&pEVar13[1].typeID = pSVar10;
        return pEVar13;
      }
      pEVar12 = (ExprGetAddress *)CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true);
      pTVar16 = this->type;
      if ((pTVar16 == (TypeBase *)0x0) || (pTVar16->typeID != 0x13)) {
        pTVar16 = (TypeBase *)0x0;
      }
      if (((pTVar16 == (TypeBase *)0x0) ||
          (((pTVar1 = (TypeStruct *)pSVar10->end, pTVar1 != (TypeStruct *)0x0 &&
            ((pTVar1->super_TypeBase).typeID == 0x13)) || (pTVar1 == ctx->typeAutoArray)))) ||
         (pTVar1 == ctx->typeAutoRef)) {
        this_00 = (ExprZeroInitialize *)
                  CreateAssignment(ctx,syntax->initializer,(ExprBase *)pEVar12,(ExprBase *)pSVar10);
      }
      else {
        pEVar13 = CreateCast(ctx,syntax->initializer,(ExprBase *)pSVar10,
                             (TypeBase *)pTVar16[1]._vptr_TypeBase,false);
        if ((pEVar12 == (ExprGetAddress *)0x0) ||
           (pEVar17 = pEVar12, (pEVar12->super_ExprBase).typeID != 0x22)) {
          pEVar17 = (ExprGetAddress *)0x0;
        }
        if (pEVar17 == (ExprGetAddress *)0x0) {
          if ((pEVar12 == (ExprGetAddress *)0x0) ||
             (pEVar17 = pEVar12, (pEVar12->super_ExprBase).typeID != 0x16)) {
            pEVar17 = (ExprGetAddress *)0x0;
          }
          if (pEVar17 != (ExprGetAddress *)0x0) {
            pEVar12 = (ExprGetAddress *)pEVar17->variable;
          }
        }
        else {
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pSVar10 = (pEVar12->super_ExprBase).source;
          pTVar14 = ExpressionContext::GetReferenceType(ctx,(pEVar12->super_ExprBase).type);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pVVar15 = (VariableHandle *)CONCAT44(extraout_var_06,iVar8);
          pVVar2 = (VariableData *)pEVar17->variable;
          pVVar15->source = (pEVar17->super_ExprBase).source;
          pVVar15->variable = pVVar2;
          pVVar15->next = (VariableHandle *)0x0;
          pVVar15->listed = false;
          ExprGetAddress::ExprGetAddress
                    ((ExprGetAddress *)CONCAT44(extraout_var_05,iVar6),pSVar10,
                     &pTVar14->super_TypeBase,pVVar15);
          pEVar12 = (ExprGetAddress *)CONCAT44(extraout_var_05,iVar6);
        }
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        this_00 = (ExprZeroInitialize *)CONCAT44(extraout_var_13,iVar6);
        pSVar10 = syntax->initializer;
        pTVar16 = ctx->typeVoid;
        (this_00->super_ExprBase).typeID = 0x20;
        (this_00->super_ExprBase).source = pSVar10;
        (this_00->super_ExprBase).type = pTVar16;
        (this_00->super_ExprBase).next = (ExprBase *)0x0;
        (this_00->super_ExprBase).listed = false;
        (this_00->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248fc0;
        this_00->address = &pEVar12->super_ExprBase;
        this_00[1].super_ExprBase._vptr_ExprBase = (_func_int **)pEVar13;
      }
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar13 = (ExprBase *)CONCAT44(extraout_var_14,iVar6);
    pTVar16 = ctx->typeVoid;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var11 = (_func_int **)CONCAT44(extraout_var_15,iVar6);
    *pp_Var11 = (_func_int *)syntax->name;
    pp_Var11[1] = (_func_int *)this;
    pp_Var11[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var11 + 3) = 0;
    pEVar13->typeID = 0x1e;
    pEVar13->source = &syntax->super_SynBase;
    pEVar13->type = pTVar16;
    pEVar13->next = (ExprBase *)0x0;
    pEVar13->listed = false;
    pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
    pEVar13[1]._vptr_ExprBase = pp_Var11;
    *(ExprZeroInitialize **)&pEVar13[1].typeID = this_00;
    return pEVar13;
  }
  uVar7 = *(int *)&(type_00->super_TypeBase).name.end - (int)(type_00->super_TypeBase).name.begin;
  pcVar18 = "ERROR: cannot create \'%.*s\' that implements \'finalize\' on stack";
LAB_0017e38d:
  anon_unknown.dwarf_c6b42::Stop(ctx,&syntax->super_SynBase,pcVar18,(ulong)uVar7);
}

Assistant:

ExprBase* AnalyzeVariableDefinition(ExpressionContext &ctx, SynVariableDefinition *syntax, unsigned alignment, TypeBase *type)
{
	if(!syntax->name)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	if(syntax->name->name == InplaceStr("this"))
		Stop(ctx, syntax, "ERROR: 'this' is a reserved keyword");

	if(isType<TypeError>(type))
	{
		if(syntax->initializer && !ctx.scope->ownerType)
			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), AnalyzeExpression(ctx, syntax->initializer));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());
	}

	InplaceStr fullName = GetVariableNameInScope(ctx, ctx.scope, syntax->name->name);

	bool conflict = CheckVariableConflict(ctx, syntax, fullName);

	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, type, new (ctx.get<SynIdentifier>()) SynIdentifier(syntax->name, fullName), 0, ctx.uniqueVariableId++);

	if (IsLookupOnlyVariable(ctx, variable))
		variable->lookupOnly = true;

	if(!conflict)
		ctx.AddVariable(variable, true);

	ExprBase *initializer = syntax->initializer && !variable->scope->ownerType ? AnalyzeExpression(ctx, syntax->initializer) : NULL;

	if(type == ctx.typeAuto)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be 'auto'");

		initializer = ResolveInitializerValue(ctx, syntax, initializer);

		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		type = initializer->type;
	}
	else if(type->isGeneric && initializer)
	{
		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		IntrusiveList<MatchData> aliases;

		TypeBase *match = MatchGenericType(ctx, syntax, type, initializer->type, aliases, true);

		if(!match || match->isGeneric)
			Stop(ctx, syntax, "ERROR: can't resolve generic type '%.*s' instance for '%.*s'", FMT_ISTR(initializer->type->name), FMT_ISTR(type->name));

		// If initiallizer is a generic function and the matched function type return type is unknown, we have to instantiate the function here to find the actual return type
		if(TypeFunction *target = getType<TypeFunction>(match))
		{
			if(isType<TypeAuto>(target->returnType))
			{
				if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
				{
					initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);

					match = bestOverload.function->type;
				}
			}
		}

		type = match;
	}
	else if(type->isGeneric)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be '%.*s'", FMT_ISTR(type->name));

		Stop(ctx, syntax, "ERROR: initializer is required to resolve generic type '%.*s'", FMT_ISTR(type->name));
	}

	if(alignment == 0)
	{
		TypeBase *parentType = ctx.scope->ownerType;

		if(parentType && parentType->alignment != 0 && parentType->alignment < type->alignment)
			alignment = parentType->alignment;
		else
			alignment = type->alignment;
	}

	// Fixup variable data not that the final type is known
	unsigned offset = AllocateVariableInScope(ctx, syntax, alignment, type);
	
	variable->type = type;
	variable->alignment = alignment;
	variable->offset = offset;

	if(TypeClass *classType = getType<TypeClass>(variable->type))
	{
		if(classType->hasFinalizer)
			Stop(ctx, syntax, "ERROR: cannot create '%.*s' that implements 'finalize' on stack", FMT_ISTR(classType->name));
	}

	if(variable->scope->ownerType)
		return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), NULL);

	if(initializer)
	{
		if(isType<TypeError>(initializer->type))
			return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);

		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		TypeArray *arrType = getType<TypeArray>(variable->type);

		// Single-level array might be set with a single element at the point of definition
		if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
		{
			initializer = CreateCast(ctx, syntax->initializer, initializer, arrType->subType, false);

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
				access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			else if(ExprDereference *node = getType<ExprDereference>(access))
				access = node->value;

			initializer = new (ctx.get<ExprArraySetup>()) ExprArraySetup(syntax->initializer, ctx.typeVoid, access, initializer);
		}
		else
		{
			initializer = CreateAssignment(ctx, syntax->initializer, access, initializer);
		}
	}
	else if(HasDefaultConstructor(ctx, syntax, variable->type))
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateGetAddress(ctx, syntax, access)))
			initializer = call;
	}
	else if(ctx.scope != ctx.globalScope && ctx.scope->ownerNamespace == NULL && variable->type->size != 0)
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
			access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
		else if(ExprDereference *node = getType<ExprDereference>(access))
			access = node->value;

		initializer = new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(syntax->initializer, ctx.typeVoid, access);
	}

	return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);
}